

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall Food::Food(Food *this,Point *p)

{
  Object *local_10;
  
  (this->super_Object).position.x = 0;
  (this->super_Object).position.y = 0;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_move_00107c78;
  (this->super_Object).ch = '%';
  Point::operator=(&(this->super_Object).position,p);
  if (Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_10 = &this->super_Object;
    std::vector<Object*,std::allocator<Object*>>::_M_realloc_insert<Object*>
              ((vector<Object*,std::allocator<Object*>> *)&Object::obj,
               (iterator)
               Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_10);
  }
  else {
    *Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
     super__Vector_impl_data._M_finish = &this->super_Object;
    Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  (this->super_Object).on_map = true;
  return;
}

Assistant:

Food::Food(const Point& p){
	ch = CHR_FOOD;
	position = p;
	obj.push_back(this);
	on_map = true;
}